

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QPoint __thiscall QAccessibleTextEdit::scrollBarPosition(QAccessibleTextEdit *this)

{
  uint uVar1;
  QWidget *pQVar2;
  QScrollBar *pQVar3;
  ulong uVar4;
  ulong uVar5;
  
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  pQVar3 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)pQVar2);
  if (pQVar3 == (QScrollBar *)0x0) {
    uVar5 = 0;
  }
  else {
    pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
    pQVar3 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)pQVar2);
    uVar1 = QAbstractSlider::sliderPosition(&pQVar3->super_QAbstractSlider);
    uVar5 = (ulong)uVar1;
  }
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  pQVar3 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)pQVar2);
  if (pQVar3 == (QScrollBar *)0x0) {
    uVar4 = 0;
  }
  else {
    pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)this);
    pQVar3 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)pQVar2);
    uVar1 = QAbstractSlider::sliderPosition(&pQVar3->super_QAbstractSlider);
    uVar4 = (ulong)uVar1 << 0x20;
  }
  return (QPoint)(uVar4 | uVar5);
}

Assistant:

QPoint QAccessibleTextEdit::scrollBarPosition() const
{
    QPoint result;
    result.setX(textEdit()->horizontalScrollBar() ? textEdit()->horizontalScrollBar()->sliderPosition() : 0);
    result.setY(textEdit()->verticalScrollBar() ? textEdit()->verticalScrollBar()->sliderPosition() : 0);
    return result;
}